

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::String::EndsWithCaseInsensitive(string *str,string *suffix)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  char *rhs;
  undefined1 local_29;
  size_t suffix_len;
  size_t str_len;
  string *suffix_local;
  string *str_local;
  
  uVar1 = std::__cxx11::string::length();
  uVar2 = std::__cxx11::string::length();
  local_29 = false;
  if (uVar2 <= uVar1) {
    lVar3 = std::__cxx11::string::c_str();
    rhs = (char *)std::__cxx11::string::c_str();
    local_29 = CaseInsensitiveCStringEquals((char *)((lVar3 + uVar1) - uVar2),rhs);
  }
  return local_29;
}

Assistant:

bool String::EndsWithCaseInsensitive(
    const std::string& str, const std::string& suffix) {
  const size_t str_len = str.length();
  const size_t suffix_len = suffix.length();
  return (str_len >= suffix_len) &&
         CaseInsensitiveCStringEquals(str.c_str() + str_len - suffix_len,
                                      suffix.c_str());
}